

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::visitLocalSet(Struct2Local *this,LocalSet *curr)

{
  ParentChildInteraction PVar1;
  bool bVar2;
  Drop *expression;
  LocalSet *curr_local;
  Struct2Local *this_local;
  
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    bVar2 = LocalSet::isTee(curr);
    if (bVar2) {
      replaceCurrent(this,curr->value);
    }
    else {
      expression = Builder::makeDrop(&this->builder,curr->value);
      replaceCurrent(this,(Expression *)expression);
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // We don't need any sets of the reference to any of the locals it
    // originally was written to.
    if (curr->isTee()) {
      replaceCurrent(curr->value);
    } else {
      replaceCurrent(builder.makeDrop(curr->value));
    }
  }